

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_compress_parallel_frames(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  LRWorkerData *pLVar1;
  uint8_t uVar2;
  AV1_COMP *pAVar3;
  bool bVar4;
  RestorationLineBuffers *pRVar5;
  uint in_EAX;
  uint uVar6;
  int iVar7;
  AVxWorkerInterface *pAVar8;
  int in_ECX;
  int iVar9;
  aom_internal_error_info *src;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  int ref_buffers_used_map;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar6 = av1_init_parallel_frame_context(first_cpi_data,ppi,(int *)((long)&uStack_38 + 4));
  prepare_fpmt_workers(ppi,first_cpi_data,(AVxWorkerHook)(ulong)uVar6,in_ECX);
  pAVar8 = aom_get_worker_interface();
  lVar10 = (long)(ppi->p_mt_info).p_num_workers;
  if (0 < lVar10) {
    do {
      (*(&pAVar8->launch)[lVar10 == 1])((ppi->p_mt_info).p_workers[lVar10 + -1]);
      bVar4 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar4);
  }
  pAVar8 = aom_get_worker_interface();
  lVar10 = (long)(ppi->p_mt_info).p_num_workers;
  bVar4 = false;
  if (lVar10 < 1) {
    bVar4 = true;
    src = (aom_internal_error_info *)0x0;
  }
  else {
    src = (aom_internal_error_info *)0x0;
    do {
      iVar7 = (*pAVar8->sync)((ppi->p_mt_info).p_workers[lVar10 + -1]);
      if (iVar7 == 0) {
        src = (ppi->parallel_cpi[lVar10 + -1]->common).error;
        bVar4 = true;
      }
      bVar12 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar12);
    bVar4 = !bVar4;
  }
  iVar7 = (ppi->p_mt_info).num_workers;
  if (0 < iVar7) {
    lVar10 = 0;
    iVar9 = 0;
    do {
      pAVar3 = ppi->parallel_cpi[lVar10];
      if ((ppi->p_mt_info).cdef_worker != (AV1CdefWorkerData *)0x0) {
        uVar2 = ((pAVar3->common).seq_params)->monochrome;
        ((pAVar3->mt_info).cdef_worker)->srcbuf = (pAVar3->mt_info).restore_state_buf.cdef_srcbuf;
        uVar11 = 0;
        do {
          ((pAVar3->mt_info).cdef_worker)->colbuf[uVar11] =
               (pAVar3->mt_info).restore_state_buf.cdef_colbuf[uVar11];
          if (uVar2 != '\0') break;
          bVar12 = uVar11 < 2;
          uVar11 = uVar11 + 1;
        } while (bVar12);
      }
      if (((((pAVar3->common).seq_params)->enable_restoration != '\0') &&
          ((pAVar3->common).features.all_lossless == false)) &&
         ((pAVar3->common).tiles.large_scale == 0)) {
        pRVar5 = (pAVar3->mt_info).restore_state_buf.rlbs;
        pLVar1 = (pAVar3->mt_info).lr_row_sync.lrworkerdata +
                 ((pAVar3->mt_info).num_workers + iVar9 + -1);
        pLVar1->rst_tmpbuf = (pAVar3->mt_info).restore_state_buf.rst_tmpbuf;
        pLVar1->rlbs = pRVar5;
      }
      lVar10 = lVar10 + 1;
      iVar9 = iVar9 + (pAVar3->mt_info).num_workers;
    } while (iVar9 < iVar7);
  }
  if (!bVar4) {
    aom_internal_error_copy(&ppi->error,src);
  }
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      av1_release_scaled_references_fpmt(ppi->parallel_cpi[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  av1_decrement_ref_counts_fpmt((ppi->cpi->common).buffer_pool,uStack_38._4_4_);
  return;
}

Assistant:

void av1_compress_parallel_frames(AV1_PRIMARY *const ppi,
                                  AV1_COMP_DATA *const first_cpi_data) {
  // Bitmask for the frame buffers referenced by cpi->scaled_ref_buf
  // corresponding to frames in the current parallel encode set.
  int ref_buffers_used_map = 0;
  int frames_in_parallel_set = av1_init_parallel_frame_context(
      first_cpi_data, ppi, &ref_buffers_used_map);
  prepare_fpmt_workers(ppi, first_cpi_data, get_compressed_data_hook,
                       frames_in_parallel_set);
  launch_fpmt_workers(ppi);
  sync_fpmt_workers(ppi, frames_in_parallel_set);

  // Release cpi->scaled_ref_buf corresponding to frames in the current parallel
  // encode set.
  for (int i = 0; i < frames_in_parallel_set; ++i) {
    av1_release_scaled_references_fpmt(ppi->parallel_cpi[i]);
  }
  av1_decrement_ref_counts_fpmt(ppi->cpi->common.buffer_pool,
                                ref_buffers_used_map);
}